

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O1

float32 helper_rsqrts_f32_arm(float32 a,float32 b,CPUARMState *env)

{
  float32 fVar1;
  float_status *s;
  
  s = &(env->vfp).standard_fp_status;
  if (((b & 0x7f800000) != 0 || (a & 0x7fffffff) != 0x7f800000) &&
     ((a & 0x7f800000) != 0 || (b & 0x7fffffff) != 0x7f800000)) {
    fVar1 = float32_mul_arm(a,b,s);
    fVar1 = float32_sub_arm(0x40400000,fVar1,s);
    fVar1 = float32_div_arm(fVar1,0x40000000,s);
    return fVar1;
  }
  if ((b & 0x7fffffff) != 0 && (a & 0x7fffffff) != 0) {
    float_raise_arm('@',s);
  }
  return 0x3fc00000;
}

Assistant:

float32 HELPER(rsqrts_f32)(float32 a, float32 b, CPUARMState *env)
{
    float_status *s = &env->vfp.standard_fp_status;
    float32 product;
    if ((float32_is_infinity(a) && float32_is_zero_or_denormal(b)) ||
        (float32_is_infinity(b) && float32_is_zero_or_denormal(a))) {
        if (!(float32_is_zero(a) || float32_is_zero(b))) {
            float_raise(float_flag_input_denormal, s);
        }
        return float32_one_point_five;
    }
    product = float32_mul(a, b, s);
    return float32_div(float32_sub(float32_three, product, s), float32_two, s);
}